

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall
xLearn::MODEL_TEST_Init_ffm_Test::MODEL_TEST_Init_ffm_Test(MODEL_TEST_Init_ffm_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014e110;
  return;
}

Assistant:

TEST(MODEL_TEST, Init_ffm) {
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size);
  real_t* b = model_ffm.GetParameter_b();
  real_t* w = model_ffm.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_ffm.GetParameter_v();
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(param_num_w, model_ffm.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_ffm.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_ffm.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t len = model_ffm.GetNumParameter_w();
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < len; i += aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }

  }
  len = model_ffm.GetNumParameter_v();
  for (index_t i = 0; i < len; i+=(kAlign*aux_size)) {
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(v[i+kAlign*j], 1.0);
    }
  }
}